

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O0

void __thiscall dtc::dtb::asm_writer::write_label(asm_writer *this,string *name)

{
  value_type_conflict1 local_1e [6];
  string *local_18;
  string *name_local;
  asm_writer *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  write_line(this,"\t.globl ");
  push_string(&this->buffer,local_18,false);
  local_1e[5] = 10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->buffer,local_1e + 5);
  push_string(&this->buffer,local_18,false);
  local_1e[4] = 0x3a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->buffer,local_1e + 4);
  local_1e[3] = 10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->buffer,local_1e + 3);
  local_1e[2] = 0x5f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->buffer,local_1e + 2);
  push_string(&this->buffer,local_18,false);
  local_1e[1] = 0x3a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->buffer,local_1e + 1);
  local_1e[0] = '\n';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->buffer,local_1e);
  return;
}

Assistant:

void
asm_writer::write_label(const string &name)
{
	write_line("\t.globl ");
	push_string(buffer, name);
	buffer.push_back('\n');
	push_string(buffer, name);
	buffer.push_back(':');
	buffer.push_back('\n');
	buffer.push_back('_');
	push_string(buffer, name);
	buffer.push_back(':');
	buffer.push_back('\n');
	
}